

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress.cpp
# Opt level: O2

void __thiscall duckdb::roaring::RoaringCompressState::FlushSegment(RoaringCompressState *this)

{
  BufferHandle *this_00;
  data_ptr_t pdVar1;
  data_ptr_t pdVar2;
  unsigned_long uVar3;
  idx_t iVar4;
  pointer pCVar5;
  long *plVar6;
  _Head_base<0UL,_duckdb::ColumnSegment_*,_false> local_58;
  ColumnCheckpointState *local_50;
  BufferHandle local_48;
  
  local_50 = ColumnDataCheckpointData::GetCheckpointState(this->checkpoint_data);
  this_00 = &this->handle;
  pdVar2 = BufferHandle::Ptr(this_00);
  uVar3 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                    ((long)this->data_ptr - (long)(pdVar2 + 8));
  iVar4 = ContainerMetadataCollection::GetMetadataSizeForSegment(&this->metadata_collection);
  pCVar5 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
           operator->(&this->current_segment);
  if ((pCVar5->super_SegmentBase<duckdb::ColumnSegment>).count.super___atomic_base<unsigned_long>.
      _M_i != 0) {
    ContainerMetadataCollection::Serialize(&this->metadata_collection,this->data_ptr);
    (this->metadata_collection).arrays_in_segment = 0;
    (this->metadata_collection).count_in_segment = 0;
    (this->metadata_collection).runs_in_segment = 0;
    pdVar1 = this->data_ptr;
    plVar6 = (long *)BufferHandle::Ptr(this_00);
    *plVar6 = (long)pdVar1 - (long)(pdVar2 + 8);
    local_58._M_head_impl =
         (this->current_segment).
         super_unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>._M_t.
         super___uniq_ptr_impl<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::ColumnSegment_*,_std::default_delete<duckdb::ColumnSegment>_>
         .super__Head_base<0UL,_duckdb::ColumnSegment_*,_false>._M_head_impl;
    (this->current_segment).
    super_unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>._M_t.
    super___uniq_ptr_impl<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::ColumnSegment_*,_std::default_delete<duckdb::ColumnSegment>_>.
    super__Head_base<0UL,_duckdb::ColumnSegment_*,_false>._M_head_impl = (ColumnSegment *)0x0;
    BufferHandle::BufferHandle(&local_48,this_00);
    (*local_50->_vptr_ColumnCheckpointState[4])
              (local_50,&local_58,&local_48,(uVar3 + 7 & 0xfffffffffffffff8) + 8 + iVar4);
    BufferHandle::~BufferHandle(&local_48);
    ::std::unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>::
    ~unique_ptr((unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_> *)
                &local_58);
  }
  return;
}

Assistant:

void RoaringCompressState::FlushSegment() {
	auto &state = checkpoint_data.GetCheckpointState();
	auto base_ptr = handle.Ptr();
	// +======================================+
	// |x|ddddddddddddddd||mmm|               |
	// +======================================+

	// x: metadata_offset (to the "right" of it)
	// d: data of the containers
	// m: metadata of the containers

	// This is after 'x'
	base_ptr += sizeof(idx_t);

	// Size of the 'd' part
	idx_t data_size = NumericCast<idx_t>(data_ptr - base_ptr);
	data_size = AlignValue(data_size);

	// Size of the 'm' part
	idx_t metadata_size = metadata_collection.GetMetadataSizeForSegment();

	if (current_segment->count.load() == 0) {
		D_ASSERT(metadata_size == 0);
		return;
	}

	idx_t serialized_metadata_size = metadata_collection.Serialize(data_ptr);
	metadata_collection.FlushSegment();
	(void)serialized_metadata_size;
	D_ASSERT(metadata_size == serialized_metadata_size);
	idx_t metadata_start = static_cast<idx_t>(data_ptr - base_ptr);
	Store<idx_t>(metadata_start, handle.Ptr());
	idx_t total_segment_size = sizeof(idx_t) + data_size + metadata_size;
	state.FlushSegment(std::move(current_segment), std::move(handle), total_segment_size);
}